

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int MRIStepReInit(void *arkode_mem,ARKRhsFn fse,ARKRhsFn fsi,realtype t0,N_Vector y0)

{
  ARKodeMRIStepMem pAVar1;
  int iVar2;
  SUNNonlinearSolver NLS;
  char *msgfmt;
  int iVar4;
  ulong uVar3;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  ARKodeMem local_48;
  realtype local_40;
  ARKodeMRIStepMem local_38;
  
  local_40 = t0;
  iVar2 = mriStep_AccessStepMem(arkode_mem,"MRIStepReInit",&local_48,&local_38);
  if (iVar2 != 0) {
    return iVar2;
  }
  if (local_48->MallocDone == 0) {
    msgfmt = "Attempt to call before ARKodeInit.";
    iVar2 = -0x17;
    iVar4 = -0x17;
  }
  else {
    auVar7._0_4_ = -(uint)((int)fse == 0);
    iVar4 = (int)((ulong)fse >> 0x20);
    auVar7._4_4_ = -(uint)(iVar4 == 0);
    auVar7._8_4_ = -(uint)((int)fsi == 0);
    iVar5 = (int)((ulong)fsi >> 0x20);
    auVar7._12_4_ = -(uint)(iVar5 == 0);
    auVar6._4_4_ = auVar7._0_4_;
    auVar6._0_4_ = auVar7._4_4_;
    auVar6._8_4_ = auVar7._12_4_;
    auVar6._12_4_ = auVar7._8_4_;
    iVar2 = movmskpd(0,auVar6 & auVar7);
    if (iVar2 == 3) {
      msgfmt = "Must specify at least one of fe, fi (both NULL).";
    }
    else {
      if (y0 != (N_Vector)0x0) {
        uVar3 = ~(CONCAT44(-(uint)((int)fsi == 0),-(uint)((int)fse == 0)) &
                 CONCAT44(-(uint)(iVar5 == 0),-(uint)(iVar4 == 0))) & (ulong)DAT_006a3e10;
        pAVar1 = local_38;
        pAVar1->explicit_rhs = (int)uVar3;
        pAVar1->implicit_rhs = (int)(uVar3 >> 0x20);
        if (((auVar6 & auVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (local_38->NLS == (SUNNonlinearSolver)0x0)) {
          NLS = SUNNonlinSol_Newton(y0,local_48->sunctx);
          if (NLS == (SUNNonlinearSolver)0x0) {
            arkProcessError(local_48,-0x14,"ARKode::MRIStep","MRIStepReInit",
                            "Error creating default Newton solver");
          }
          else {
            iVar2 = MRIStepSetNonlinearSolver(local_48,NLS);
            if (iVar2 == 0) {
              local_38->ownNLS = 1;
              goto LAB_004124e4;
            }
            arkProcessError(local_48,-0x14,"ARKode::MRIStep","MRIStepReInit",
                            "Error attaching default Newton solver");
          }
          MRIStepFree(&local_48);
          return -0x14;
        }
LAB_004124e4:
        iVar2 = arkInit((ARKodeMem)arkode_mem,local_40,y0,0);
        if (iVar2 != 0) {
          arkProcessError(local_48,iVar2,"ARKode::MRIStep","MRIStepReInit",
                          "Unable to reinitialize main ARKode infrastructure");
          return iVar2;
        }
        local_38->fse = fse;
        local_38->fsi = fsi;
        local_38->nstlp = 0;
        pAVar1->nfse = 0;
        pAVar1->nfsi = 0;
        pAVar1->nsetups = 0;
        pAVar1->nls_iters = 0;
        return 0;
      }
      msgfmt = "y0 = NULL illegal.";
    }
    iVar2 = -0x16;
    iVar4 = -0x16;
  }
  arkProcessError(local_48,iVar4,"ARKode::MRIStep","MRIStepReInit",msgfmt);
  return iVar2;
}

Assistant:

int MRIStepReInit(void* arkode_mem, ARKRhsFn fse, ARKRhsFn fsi, realtype t0,
                  N_Vector y0)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  SUNNonlinearSolver NLS;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepReInit",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode::MRIStep",
                    "MRIStepReInit", MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }

  /* Check that at least one of fse, fsi is supplied and is to be used */
  if (fse == NULL && fsi == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepReInit", MSG_ARK_NULL_F);
    return(ARK_ILL_INPUT);
  }

  /* Check that y0 is supplied */
  if (y0 == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepReInit", MSG_ARK_NULL_Y0);
    return(ARK_ILL_INPUT);
  }

  /* Set implicit/explicit problem based on function pointers */
  step_mem->explicit_rhs = (fse == NULL) ? SUNFALSE : SUNTRUE;
  step_mem->implicit_rhs = (fsi == NULL) ? SUNFALSE : SUNTRUE;

  /* Create a default Newton NLS object (just in case; will be deleted if
     the user attaches a nonlinear solver) */
  if (step_mem->implicit_rhs && !(step_mem->NLS)) {
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (!NLS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepReInit", "Error creating default Newton solver");
      MRIStepFree((void**) &ark_mem); return(ARK_MEM_FAIL);
    }
    retval = MRIStepSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepReInit", "Error attaching default Newton solver");
      MRIStepFree((void**) &ark_mem);  return(ARK_MEM_FAIL);
    }
    step_mem->ownNLS = SUNTRUE;
  }

  /* ReInitialize main ARKode infrastructure */
  retval = arkInit(arkode_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::MRIStep", "MRIStepReInit",
                    "Unable to reinitialize main ARKode infrastructure");
    return(retval);
  }

  /* Copy the input parameters into ARKode state */
  step_mem->fse = fse;
  step_mem->fsi = fsi;

  /* Initialize all the counters */
  step_mem->nfse      = 0;
  step_mem->nfsi      = 0;
  step_mem->nsetups   = 0;
  step_mem->nstlp     = 0;
  step_mem->nls_iters = 0;

  return(ARK_SUCCESS);
}